

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

int load_iv(char **fromp,uchar *to,size_t num)

{
  int iVar1;
  ulong local_48;
  size_t i_1;
  size_t i;
  char *from;
  ulong uStack_28;
  uint8_t v;
  size_t num_local;
  uchar *to_local;
  char **fromp_local;
  
  i = (size_t)*fromp;
  for (i_1 = 0; i_1 < num; i_1 = i_1 + 1) {
    to[i_1] = '\0';
  }
  uStack_28 = num << 1;
  local_48 = 0;
  num_local = (size_t)to;
  to_local = (uchar *)fromp;
  while( true ) {
    if (uStack_28 <= local_48) {
      *(size_t *)to_local = i;
      return 1;
    }
    iVar1 = OPENSSL_fromxdigit((uint8_t *)((long)&from + 7),(int)*(char *)i);
    if (iVar1 == 0) break;
    i = i + 1;
    *(byte *)(num_local + (local_48 >> 1)) =
         *(byte *)(num_local + (local_48 >> 1)) |
         from._7_1_ << ((((local_48 & 1) != 0 ^ 0xffU) & 1) << 2);
    local_48 = local_48 + 1;
  }
  ERR_put_error(9,0,0x67,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                ,0x1c9);
  return 0;
}

Assistant:

static int load_iv(const char **fromp, unsigned char *to, size_t num) {
  uint8_t v;
  const char *from;

  from = *fromp;
  for (size_t i = 0; i < num; i++) {
    to[i] = 0;
  }
  num *= 2;
  for (size_t i = 0; i < num; i++) {
    if (!OPENSSL_fromxdigit(&v, *from)) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_IV_CHARS);
      return 0;
    }
    from++;
    to[i / 2] |= v << (!(i & 1)) * 4;
  }

  *fromp = from;
  return 1;
}